

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcmc_main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  ulong uVar1;
  _Base_ptr p_Var2;
  pointer *ppvVar3;
  float fVar4;
  float fVar5;
  pointer pfVar6;
  _func_int **pp_Var7;
  metropolis_hasting *this;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  int iVar10;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar11;
  char *pcVar12;
  typed_value<std::vector<float,_std::allocator<float>_>,_char> *ptVar13;
  typed_value<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_char> *ptVar14;
  typed_value<unsigned_int,_char> *ptVar15;
  const_iterator cVar16;
  long *plVar17;
  const_iterator cVar18;
  const_iterator cVar19;
  pointer puVar20;
  float *pfVar21;
  size_t __i;
  long *plVar22;
  size_type *psVar23;
  long lVar24;
  ulong uVar25;
  undefined *puVar26;
  uint uVar27;
  char *pcVar28;
  pointer pvVar29;
  uint s;
  ulong uVar30;
  ulong uVar31;
  pointer pvVar32;
  ostream *poVar33;
  long lVar34;
  uint g;
  ulong uVar35;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  uint sampling_steps;
  float_vec_t cooling_schedule_kwargs;
  uint seed;
  uint_mat_t marginal;
  uint sampling_frequency;
  uint burn_in;
  uint_vec_t n;
  string cooling_schedule;
  float_mat_t p;
  edge_list_t edge_list;
  uint_vec_t memberships_init;
  uint_vec_t memberships;
  adj_list_t adj_list;
  string edge_list_path;
  float_vec_t probabilities;
  blockmodel_t blockmodel;
  options_description description;
  variables_map var_map;
  mt19937 engine;
  allocator_type local_17c5;
  uint local_17c4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_17c0;
  vector<float,_std::allocator<float>_> local_17b8;
  uint local_1798;
  allocator_type local_1791;
  metropolis_hasting *local_1790;
  vector<float,_std::allocator<float>_> local_1788;
  _Base_ptr local_1770;
  value_type_conflict2 local_1764;
  uint local_1760;
  uint local_175c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1758;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1740;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_1720;
  edge_list_t local_1708;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_16e8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_16c8;
  _Base_ptr local_16b0;
  _Base_ptr local_16a8;
  adj_list_t local_16a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1688;
  vector<float,_std::allocator<float>_> local_1668;
  ulong local_1648;
  _Base_ptr local_1640;
  blockmodel_t local_1638;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_15d8;
  uint_vec_t local_15c0;
  vector<float,_std::allocator<float>_> local_15a8;
  vector<float,_std::allocator<float>_> local_1590;
  vector<float,_std::allocator<float>_> local_1578;
  vector<float,_std::allocator<float>_> local_1560;
  vector<float,_std::allocator<float>_> local_1548;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_1530;
  string local_1518;
  undefined1 *local_14f8 [2];
  undefined1 local_14e8 [24];
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_14d0 [24];
  void *local_14b8;
  undefined4 local_14b0;
  undefined8 local_14a8;
  undefined4 local_14a0;
  undefined8 local_1498;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_1490 [24];
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_1478;
  code *local_1458 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_1448 [8];
  _Rb_tree_node_base local_1440;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1418 [48];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_13e8;
  undefined1 local_13b8 [4992];
  size_t local_38;
  
  local_1688._M_dataplus._M_p = (pointer)&local_1688.field_2;
  local_1688._M_string_length = 0;
  local_1688.field_2._M_local_buf[0] = '\0';
  local_1668.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1668.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1668.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1758.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1758.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1758.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1740._M_dataplus._M_p = (pointer)&local_1740.field_2;
  local_1740._M_string_length = 0;
  local_1740.field_2._M_local_buf[0] = '\0';
  local_17b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_17b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_17b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_17b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)operator_new(8);
  local_17b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_17b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start + 2;
  local_17b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start[0] = 0.0;
  local_17b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start[1] = 0.0;
  local_1798 = 0;
  pcVar28 = local_13b8 + 0x10;
  local_17b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_17b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  local_13b8._0_8_ = pcVar28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_13b8,"Options","");
  boost::program_options::options_description::options_description
            ((options_description *)local_14f8,(string *)local_13b8,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  if ((char *)local_13b8._0_8_ != pcVar28) {
    operator_delete((void *)local_13b8._0_8_);
  }
  local_1458[0] = (code *)boost::program_options::options_description::add_options();
  ptVar11 = boost::program_options::value<std::__cxx11::string>(&local_1688);
  pcVar12 = (char *)boost::program_options::options_description_easy_init::operator()
                              ((char *)local_1458,(value_semantic *)"edge_list_path,e",
                               (char *)ptVar11);
  ptVar13 = boost::program_options::value<std::vector<float,std::allocator<float>>>(&local_1668);
  ptVar13->m_multitoken = true;
  pcVar12 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar12,(value_semantic *)"probabilities,P",(char *)ptVar13);
  ptVar14 = boost::program_options::value<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                      (&local_1758);
  ptVar14->m_multitoken = true;
  pcVar12 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar12,(value_semantic *)"n,n",(char *)ptVar14);
  ptVar15 = boost::program_options::value<unsigned_int>(&local_175c);
  local_1638.adj_list_ptr_ = (adj_list_t *)CONCAT44(local_1638.adj_list_ptr_._4_4_,1000);
  ptVar15 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                      (ptVar15,(uint *)&local_1638);
  pcVar12 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar12,(value_semantic *)"burn_in,b",(char *)ptVar15);
  ptVar15 = boost::program_options::value<unsigned_int>(&local_17c4);
  local_1708.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_1708.
                         super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,1000);
  ptVar15 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                      (ptVar15,(uint *)&local_1708);
  pcVar12 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar12,(value_semantic *)"sampling_steps,t",(char *)ptVar15);
  ptVar15 = boost::program_options::value<unsigned_int>(&local_1760);
  local_16a0.
  super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 10;
  ptVar15 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                      (ptVar15,(uint *)&local_16a0);
  pcVar12 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar12,(value_semantic *)"sampling_frequency,f",(char *)ptVar15);
  pcVar12 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar12,"randomize,r");
  pcVar12 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar12,"use_ppm,u");
  pcVar12 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar12,"use_single_vertex,s");
  pcVar12 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar12,"maximize,m");
  ptVar11 = boost::program_options::value<std::__cxx11::string>(&local_1740);
  local_13b8._0_8_ = pcVar28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_13b8,"exponential","");
  ptVar11 = boost::program_options::
            typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
            ::default_value(ptVar11,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_13b8);
  pcVar12 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar12,(value_semantic *)"cooling_schedule,c",(char *)ptVar11);
  ptVar13 = boost::program_options::value<std::vector<float,std::allocator<float>>>(&local_17b8);
  ptVar13->m_multitoken = true;
  pcVar12 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar12,(value_semantic *)"cooling_schedule_kwargs,a",(char *)ptVar13
                              );
  ptVar15 = boost::program_options::value<unsigned_int>(&local_1798);
  pcVar12 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar12,(value_semantic *)"seed,d",(char *)ptVar15);
  boost::program_options::options_description_easy_init::operator()(pcVar12,"help,h");
  if ((char *)local_13b8._0_8_ != pcVar28) {
    operator_delete((void *)local_13b8._0_8_);
  }
  boost::program_options::variables_map::variables_map((variables_map *)local_1458);
  local_1478.super_function_base.vtable = (vtable_base *)0x0;
  local_1478.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
  local_1478.super_function_base.functor._8_8_ = 0;
  local_1478.super_function_base.functor._16_8_ = 0;
  boost::program_options::parse_command_line<char>
            ((basic_parsed_options<char> *)local_13b8,argc,argv,(options_description *)local_14f8,0,
             &local_1478);
  boost::program_options::store
            ((basic_parsed_options *)local_13b8,(variables_map *)local_1458,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)local_13b8);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(&local_1478);
  boost::program_options::notify((variables_map *)local_1458);
  local_13b8._0_8_ = pcVar28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_13b8,"help","");
  cVar16 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::find(local_1448,(key_type *)local_13b8);
  p_Var2 = &local_1440;
  if ((char *)local_13b8._0_8_ != pcVar28) {
    operator_delete((void *)local_13b8._0_8_);
  }
  if (argc == 1 || cVar16._M_node != p_Var2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"MCMC algorithms for the SBM (final output only)\n",0x30);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Usage:\n",7);
    std::__cxx11::string::string((string *)&local_1708,*argv,(allocator *)&local_16a0);
    plVar17 = (long *)std::__cxx11::string::replace((ulong)&local_1708,0,(char *)0x0,0x1215b3);
    ppvVar3 = &local_1638.k_.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    plVar22 = plVar17 + 2;
    if ((pointer *)*plVar17 == (pointer *)plVar22) {
      local_1638.k_.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)*plVar22;
      local_1638.k_.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)plVar17[3];
      local_1638.adj_list_ptr_ = (adj_list_t *)ppvVar3;
    }
    else {
      local_1638.k_.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)*plVar22;
      local_1638.adj_list_ptr_ = (adj_list_t *)*plVar17;
    }
    local_1638.k_.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)plVar17[1];
    *plVar17 = (long)plVar22;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    plVar17 = (long *)std::__cxx11::string::append((char *)&local_1638);
    psVar23 = (size_type *)(plVar17 + 2);
    if ((size_type *)*plVar17 == psVar23) {
      local_13b8._16_8_ = *psVar23;
      local_13b8._24_8_ = plVar17[3];
      local_13b8._0_8_ = pcVar28;
    }
    else {
      local_13b8._16_8_ = *psVar23;
      local_13b8._0_8_ = (size_type *)*plVar17;
    }
    local_13b8._8_8_ = plVar17[1];
    *plVar17 = (long)psVar23;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,(char *)local_13b8._0_8_,local_13b8._8_8_);
    if ((char *)local_13b8._0_8_ != pcVar28) {
      operator_delete((void *)local_13b8._0_8_);
    }
    if (local_1638.adj_list_ptr_ != (adj_list_t *)ppvVar3) {
      operator_delete(local_1638.adj_list_ptr_);
    }
    if (local_1708.
        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pointer)&local_1708.
                  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(local_1708.
                      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    iVar10 = 0;
    boost::program_options::operator<<((ostream *)&std::cout,(options_description *)local_14f8);
    goto LAB_00116235;
  }
  local_13b8._0_8_ = pcVar28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_13b8,"edge_list_path","");
  cVar16 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::find(local_1448,(key_type *)local_13b8);
  if ((char *)local_13b8._0_8_ != pcVar28) {
    operator_delete((void *)local_13b8._0_8_);
  }
  poVar33 = (ostream *)&std::cout;
  if (cVar16._M_node == p_Var2) {
    lVar24 = 0x25;
    pcVar28 = "edge_list_path is required (-e flag)\n";
  }
  else {
    local_13b8._0_8_ = pcVar28;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_13b8,"n","");
    cVar16 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::find(local_1448,(key_type *)local_13b8);
    if ((char *)local_13b8._0_8_ != pcVar28) {
      operator_delete((void *)local_13b8._0_8_);
    }
    if (cVar16._M_node != p_Var2) {
      local_13b8._0_8_ = pcVar28;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_13b8,"randomize","");
      local_16a8 = (_Base_ptr)
                   std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   ::find(local_1448,(key_type *)local_13b8);
      if ((char *)local_13b8._0_8_ != pcVar28) {
        operator_delete((void *)local_13b8._0_8_);
      }
      local_13b8._0_8_ = pcVar28;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_13b8,"use_ppm","");
      local_1770 = (_Base_ptr)
                   std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   ::find(local_1448,(key_type *)local_13b8);
      if ((char *)local_13b8._0_8_ != pcVar28) {
        operator_delete((void *)local_13b8._0_8_);
      }
      local_13b8._0_8_ = pcVar28;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_13b8,"use_single_vertex","");
      cVar16 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               ::find(local_1448,(key_type *)local_13b8);
      if ((char *)local_13b8._0_8_ != pcVar28) {
        operator_delete((void *)local_13b8._0_8_);
      }
      local_13b8._0_8_ = pcVar28;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_13b8,"maximize","");
      cVar18 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               ::find(local_1448,(key_type *)local_13b8);
      if ((char *)local_13b8._0_8_ != pcVar28) {
        operator_delete((void *)local_13b8._0_8_);
      }
      if (cVar18._M_node != p_Var2) {
        local_13b8._0_8_ = pcVar28;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_13b8,"cooling_schedule_kwargs","");
        cVar19 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                 ::find(local_1448,(key_type *)local_13b8);
        if ((char *)local_13b8._0_8_ != pcVar28) {
          operator_delete((void *)local_13b8._0_8_);
        }
        iVar10 = std::__cxx11::string::compare((char *)&local_1740);
        if (cVar19._M_node != p_Var2) {
          if (iVar10 == 0) {
            if (*local_17b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start <= 0.0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,
                         "Invalid cooling schedule argument for linear schedule: T_0 must be grater than 0.\n"
                         ,0x52);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Passed value: T_0=",0x12);
              pfVar21 = local_17b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start;
            }
            else {
              if ((0.0 < local_17b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start[1]) &&
                 (local_17b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start[1] < 1.0)) goto LAB_00115424;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,
                         "Invalid cooling schedule argument for exponential schedule: alpha must be in ]0,1[.\n"
                         ,0x54);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Passed value: alpha=",0x14);
LAB_001161c7:
              pfVar21 = local_17b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start + 1;
            }
          }
          else {
            iVar10 = std::__cxx11::string::compare((char *)&local_1740);
            if (iVar10 != 0) {
              iVar10 = std::__cxx11::string::compare((char *)&local_1740);
              if (iVar10 == 0) {
                if (*local_17b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start <= 0.0) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,
                             "Invalid cooling schedule argument for logarithmic schedule: c must be greater than 0.\n"
                             ,0x56);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,"Passed value: c=",0x10);
                  pfVar21 = local_17b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  goto LAB_0011620a;
                }
                if (local_17b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start[1] <= 0.0) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,
                             "Invalid cooling schedule argument for logarithmic schedule: d must be greater than 0.\n"
                             ,0x56);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,"Passed value: d=",0x10);
                  goto LAB_001161c7;
                }
              }
              else {
                iVar10 = std::__cxx11::string::compare((char *)&local_1740);
                if (iVar10 != 0) {
                  lVar24 = 0x48;
                  pcVar28 = 
                  "Invalid cooling schedule. Options are exponential, linear, logarithmic.\n";
                  poVar33 = (ostream *)&std::cerr;
                  goto LAB_00116228;
                }
                if (*local_17b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start <= 0.0) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,
                             "Invalid cooling schedule argument for constant schedule: temperature must be greater than 0.\n"
                             ,0x5d);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,"Passed value: T=",0x10);
                  pfVar21 = local_17b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  goto LAB_0011620a;
                }
              }
              goto LAB_00115424;
            }
            fVar4 = *local_17b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if (fVar4 <= 0.0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,
                         "Invalid cooling schedule argument for linear schedule: T_0 must be grater than 0.\n"
                         ,0x52);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Passed value: T_0=",0x12);
              pfVar21 = local_17b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start;
            }
            else {
              fVar5 = local_17b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start[1];
              if ((fVar5 <= 0.0) || (fVar4 < fVar5)) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,
                           "Invalid cooling schedule argument for linear schedule: eta must be in ]0, T_0].\n"
                           ,0x50);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Passed value: T_0=",0x12);
                poVar33 = std::ostream::_M_insert<double>
                                    ((double)*local_17b8.
                                              super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data._M_start);
                std::__ostream_insert<char,std::char_traits<char>>(poVar33,", eta=",6);
                goto LAB_001161c7;
              }
              if (fVar5 * (float)local_17c4 <= fVar4) goto LAB_00115424;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,
                         "Invalid cooling schedule argument for linear schedule: eta * sampling_steps must be smaller or equal to T_0.\n"
                         ,0x6d);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Passed value: eta*sampling_steps=",0x21);
              poVar33 = std::ostream::_M_insert<double>
                                  ((double)((float)local_17c4 *
                                           local_17b8.
                                           super__Vector_base<float,_std::allocator<float>_>._M_impl
                                           .super__Vector_impl_data._M_start[1]));
              std::__ostream_insert<char,std::char_traits<char>>(poVar33,", T_0=",6);
              pfVar21 = local_17b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start;
            }
          }
LAB_0011620a:
          poVar33 = std::ostream::_M_insert<double>((double)*pfVar21);
          lVar24 = 1;
          pcVar28 = "\n";
          goto LAB_00116228;
        }
        if (iVar10 == 0) {
          local_17b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[0] = 1.0;
          local_17b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[1] = 0.99;
        }
        iVar10 = std::__cxx11::string::compare((char *)&local_1740);
        if (iVar10 == 0) {
          *local_17b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start = (float)(local_17c4 + 1);
          local_17b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[1] = 1.0;
        }
        iVar10 = std::__cxx11::string::compare((char *)&local_1740);
        if (iVar10 == 0) {
          local_17b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[0] = 1.0;
          local_17b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[1] = 1.0;
        }
        iVar10 = std::__cxx11::string::compare((char *)&local_1740);
        if (iVar10 == 0) {
          *local_17b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start = 1.0;
        }
      }
LAB_00115424:
      local_13b8._0_8_ = pcVar28;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_13b8,"seed","");
      cVar19 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               ::find(local_1448,(key_type *)local_13b8);
      if ((char *)local_13b8._0_8_ != pcVar28) {
        operator_delete((void *)local_13b8._0_8_);
      }
      p_Var8 = local_1770;
      if (cVar19._M_node == p_Var2) {
        local_1798 = std::chrono::_V2::system_clock::now();
      }
      local_13b8._0_8_ = ZEXT48(local_1798);
      lVar24 = 1;
      pcVar28 = (char *)local_13b8._0_8_;
      do {
        pcVar28 = (char *)(ulong)(((uint)((ulong)pcVar28 >> 0x1e) ^ (uint)pcVar28) * 0x6c078965 +
                                 (int)lVar24);
        *(char **)(local_13b8 + lVar24 * 8) = pcVar28;
        lVar24 = lVar24 + 1;
      } while (lVar24 != 0x270);
      local_38 = 0x270;
      uVar35 = (long)local_1758.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_1758.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 2;
      g = (uint)uVar35;
      if (g == 0) {
        uVar27 = 0;
      }
      else {
        uVar25 = 0;
        uVar27 = 0;
        do {
          uVar27 = uVar27 + local_1758.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar25];
          uVar25 = uVar25 + 1;
        } while ((uVar35 & 0xffffffff) != uVar25);
      }
      local_1708.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1708.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1708.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_16b0 = cVar16._M_node;
      local_1640 = cVar18._M_node;
      local_1518._M_dataplus._M_p = (pointer)&local_1518.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1518,local_1688._M_dataplus._M_p,
                 local_1688._M_dataplus._M_p + local_1688._M_string_length);
      load_edge_list(&local_1708,&local_1518);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1518._M_dataplus._M_p != &local_1518.field_2) {
        operator_delete(local_1518._M_dataplus._M_p);
      }
      edge_to_adj(&local_16a0,&local_1708,uVar27);
      if (local_1708.
          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_1708.
          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        local_1708.
        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_1708.
             super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      }
      local_16e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_16e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_16e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      uVar25 = 0;
      puVar20 = local_1758.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (local_1758.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_1758.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        do {
          uVar27 = (int)uVar25 + *puVar20;
          uVar25 = (ulong)uVar27;
          puVar20 = puVar20 + 1;
        } while (puVar20 !=
                 local_1758.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish);
        uVar25 = (ulong)uVar27;
      }
      local_1638.adj_list_ptr_ =
           (adj_list_t *)((ulong)local_1638.adj_list_ptr_ & 0xffffffff00000000);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                (&local_16e8,uVar25,(value_type_conflict2 *)&local_1638);
      if ((long)local_1758.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_1758.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != 0) {
        uVar25 = 0;
        iVar10 = 0;
        do {
          uVar27 = local_1758.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar25];
          if (uVar27 != 0) {
            uVar31 = 0;
            do {
              local_16e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[(uint)(iVar10 + (int)uVar31)] = (uint)uVar25;
              uVar31 = uVar31 + 1;
              uVar27 = local_1758.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar25];
            } while (uVar31 < uVar27);
          }
          iVar10 = iVar10 + uVar27;
          uVar25 = uVar25 + 1;
        } while ((uVar25 & 0xffffffff) <
                 (ulong)((long)local_1758.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_1758.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 2));
      }
      blockmodel_t::blockmodel_t
                (&local_1638,&local_16e8,g,
                 (int)((ulong)((long)local_16a0.
                                     super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              CONCAT44(local_16a0.
                                       super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       local_16a0.
                                       super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_4_)) >> 4) *
                 -0x55555555,&local_16a0);
      if (local_16e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_16e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_16e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_16e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
      if (local_16a8 != p_Var2) {
        blockmodel_t::shuffle(&local_1638,(mt19937 *)local_13b8);
      }
      uVar25 = uVar35 & 0xffffffff;
      local_16c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = 0;
      std::vector<float,_std::allocator<float>_>::vector
                (&local_1788,uVar25,(value_type_conflict1 *)&local_16c8,
                 (allocator_type *)&local_1764);
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::vector(&local_1720,uVar25,&local_1788,&local_17c5);
      if ((metropolis_hasting *)
          local_1788.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (metropolis_hasting *)0x0) {
        operator_delete(local_1788.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (p_Var8 == p_Var2) {
        if (g != 0) {
          lVar24 = 0;
          uVar31 = 0;
          do {
            pfVar6 = local_1720.
                     super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar31].
                     super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar30 = 0;
            do {
              pfVar6[uVar30] =
                   local_1668.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start[(uint)((int)lVar24 + (int)uVar30)];
              uVar30 = uVar30 + 1;
            } while ((uVar35 & 0xffffffff) != uVar30);
            uVar31 = uVar31 + 1;
            lVar24 = lVar24 + uVar35;
          } while (uVar31 != (uVar35 & 0xffffffff));
        }
      }
      else if (g != 0) {
        lVar24 = 0;
        uVar31 = uVar35;
        uVar30 = 0;
        pvVar29 = local_1720.
                  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          pvVar29 = pvVar29 + 1;
          pfVar6 = local_1720.
                   super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar30].
                   super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
                   ._M_start;
          pfVar6[uVar30] =
               *local_1668.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
          uVar1 = uVar30 + 1;
          if (uVar1 < (uVar35 & 0xffffffff)) {
            lVar34 = 1;
            pvVar32 = pvVar29;
            do {
              *(float *)((long)pfVar6 + lVar34 * 4 + lVar24) =
                   local_1668.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start[1];
              (pvVar32->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar30] =
                   local_1668.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start[1];
              lVar34 = lVar34 + 1;
              pvVar32 = pvVar32 + 1;
            } while ((int)uVar31 != (int)lVar34);
          }
          lVar24 = lVar24 + 4;
          uVar31 = uVar31 - 1;
          uVar30 = uVar1;
        } while (uVar1 != (uVar35 & 0xffffffff));
      }
      local_1648 = uVar25;
      if (local_16b0 != p_Var2 && local_1770 == p_Var2) {
        local_17c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
        local_17c0->_M_use_count = 1;
        local_17c0->_M_weak_count = 1;
        local_17c0->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00129a98;
        local_17c0[1]._vptr__Sp_counted_base = (_func_int **)0x0;
        local_17c0[1]._M_use_count = 0;
        local_17c0[1]._M_weak_count = 0;
        local_17c0[1]._M_use_count = 0;
        local_17c0[1]._M_weak_count = 0;
        local_17c0[2]._vptr__Sp_counted_base = (_func_int **)0x3ff0000000000000;
        puVar26 = &mh_single_vertex_sbm::vtable;
LAB_001158eb:
        local_1790 = (metropolis_hasting *)(local_17c0 + 1);
        local_17c0[1]._vptr__Sp_counted_base = (_func_int **)(puVar26 + 0x10);
      }
      else {
        if (local_1770 != p_Var2 && local_16b0 != p_Var2) {
          local_17c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
          local_17c0->_M_use_count = 1;
          local_17c0->_M_weak_count = 1;
          local_17c0->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00129b78;
          local_17c0[1]._vptr__Sp_counted_base = (_func_int **)0x0;
          local_17c0[1]._M_use_count = 0;
          local_17c0[1]._M_weak_count = 0;
          local_17c0[1]._M_use_count = 0;
          local_17c0[1]._M_weak_count = 0;
          local_17c0[2]._vptr__Sp_counted_base = (_func_int **)0x3ff0000000000000;
          puVar26 = &mh_single_vertex_ppm::vtable;
          goto LAB_001158eb;
        }
        if (local_1770 == p_Var2 && local_16b0 == p_Var2) {
          std::make_shared<mh_vertices_swap_sbm>();
LAB_001160fc:
          local_1790 = (metropolis_hasting *)
                       local_1788.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start;
          local_17c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_1788.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish;
          local_1788.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_1788.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
        }
        else {
          if (local_1770 != p_Var2 && local_16b0 == p_Var2) {
            std::make_shared<mh_vertices_swap_ppm>();
            goto LAB_001160fc;
          }
          local_1790 = (metropolis_hasting *)0x0;
          local_17c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::clog,"edge_list_path: ",0x10);
      poVar33 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::clog,local_1688._M_dataplus._M_p,
                           local_1688._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar33,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::clog,"probabilities:\n",0xf);
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::vector(&local_1530,&local_1720);
      output_mat<std::vector<std::vector<float,std::allocator<float>>,std::allocator<std::vector<float,std::allocator<float>>>>>
                (&local_1530,(ostream *)&std::clog);
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::~vector(&local_1530);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"sizes (g=",9);
      poVar33 = std::ostream::_M_insert<unsigned_long>((ulong)&std::clog);
      std::__ostream_insert<char,std::char_traits<char>>(poVar33,"): ",3);
      puVar20 = local_1758.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (local_1758.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_1758.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        do {
          poVar33 = std::ostream::_M_insert<unsigned_long>((ulong)&std::clog);
          std::__ostream_insert<char,std::char_traits<char>>(poVar33," ",1);
          puVar20 = puVar20 + 1;
        } while (puVar20 !=
                 local_1758.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"\n",1);
      p_Var9 = local_1640;
      p_Var8 = local_1770;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"burn_in: ",9);
      poVar33 = std::ostream::_M_insert<unsigned_long>((ulong)&std::clog);
      std::__ostream_insert<char,std::char_traits<char>>(poVar33,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::clog,"sampling_steps: ",0x10);
      poVar33 = std::ostream::_M_insert<unsigned_long>((ulong)&std::clog);
      std::__ostream_insert<char,std::char_traits<char>>(poVar33,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::clog,"sampling_frequency: ",0x14);
      poVar33 = std::ostream::_M_insert<unsigned_long>((ulong)&std::clog);
      std::__ostream_insert<char,std::char_traits<char>>(poVar33,"\n",1);
      pcVar28 = "maximize: true\n";
      if (p_Var9 == p_Var2) {
        pcVar28 = "maximize: false\n";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::clog,pcVar28,(ulong)(p_Var9 == p_Var2) + 0xf);
      pcVar28 = "use_ppm: true\n";
      if (p_Var8 == p_Var2) {
        pcVar28 = "use_ppm: false\n";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::clog,pcVar28,(ulong)(p_Var8 == p_Var2) | 0xe);
      pcVar28 = "use_single_vertex: true\n";
      if (local_16b0 == p_Var2) {
        pcVar28 = "use_single_vertex: false\n";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::clog,pcVar28,(ulong)(local_16b0 == p_Var2) | 0x18);
      pcVar28 = "randomize: true\n";
      if (local_16a8 == p_Var2) {
        pcVar28 = "randomize: false\n";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::clog,pcVar28,(ulong)(local_16a8 == p_Var2) | 0x10);
      if (p_Var9 != p_Var2) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::clog,"cooling_schedule: ",0x12);
        poVar33 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::clog,local_1740._M_dataplus._M_p,
                             local_1740._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar33,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::clog,"cooling_schedule_kwargs: ",0x19);
        std::vector<float,_std::allocator<float>_>::vector(&local_1548,&local_17b8);
        output_vec<std::vector<float,std::allocator<float>>>(&local_1548,(ostream *)&std::clog);
        if (local_1548.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1548.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"seed: ",6);
      poVar33 = std::ostream::_M_insert<unsigned_long>((ulong)&std::clog);
      std::__ostream_insert<char,std::char_traits<char>>(poVar33,"\n",1);
      lVar24 = CONCAT44(local_16a0.
                        super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start._4_4_,
                        local_16a0.
                        super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start._0_4_);
      local_1764 = 0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_16c8,local_1648,&local_1764,(allocator_type *)&local_17c5);
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                *)&local_1788,
               ((long)local_16a0.
                      super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - lVar24 >> 4) *
               -0x5555555555555555,&local_16c8,&local_1791);
      if ((void *)CONCAT44(local_16c8.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start._4_4_,
                           local_16c8.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
        operator_delete((void *)CONCAT44(local_16c8.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                         local_16c8.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start._0_4_));
      }
      if (p_Var9 == p_Var2) {
        local_1770 = (_Base_ptr)
                     metropolis_hasting::marginalize
                               (local_1790,&local_1638,(uint_mat_t *)&local_1788,&local_1720,
                                local_175c,local_1760,local_17c4,(mt19937 *)local_13b8);
        uVar27 = blockmodel_t::get_N(&local_1638);
        local_1764 = 0;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (&local_16c8,(ulong)uVar27,&local_1764,(allocator_type *)&local_17c5);
        for (uVar25 = 0; uVar27 = blockmodel_t::get_N(&local_1638), this_00 = local_17c0,
            uVar25 < uVar27; uVar25 = uVar25 + 1) {
          if (g != 0) {
            pp_Var7 = ((metropolis_hasting *)
                      ((long)local_1788.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_start + uVar25 * 0x18))->
                      _vptr_metropolis_hasting;
            uVar31 = 0;
            uVar27 = 0;
            do {
              if (uVar27 < *(uint *)((long)pp_Var7 + uVar31 * 4)) {
                *(int *)(CONCAT44(local_16c8.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                  local_16c8.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start._0_4_) + uVar25 * 4) =
                     (int)uVar31;
                uVar27 = *(uint *)((long)pp_Var7 + uVar31 * 4);
              }
              uVar31 = uVar31 + 1;
            } while ((uVar35 & 0xffffffff) != uVar31);
          }
        }
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_15d8,&local_16c8);
        output_vec<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                  (&local_15d8,(ostream *)&std::cout);
        if (local_15d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_15d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::clog,"acceptance ratio ",0x11);
        poVar33 = std::ostream::_M_insert<double>((double)local_1770);
        std::__ostream_insert<char,std::char_traits<char>>(poVar33,"\n",1);
        local_15c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_16c8.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,
                               local_16c8.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_4_);
      }
      else {
        iVar10 = std::__cxx11::string::compare((char *)&local_1740);
        this = local_1790;
        this_00 = local_17c0;
        if (iVar10 == 0) {
          std::vector<float,_std::allocator<float>_>::vector(&local_1560,&local_17b8);
          metropolis_hasting::anneal
                    (this,&local_1638,&local_1720,exponential_schedule,&local_1560,local_17c4,
                     (mt19937 *)local_13b8);
          if (local_1560.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_1560.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
        }
        iVar10 = std::__cxx11::string::compare((char *)&local_1740);
        if (iVar10 == 0) {
          std::vector<float,_std::allocator<float>_>::vector(&local_1578,&local_17b8);
          metropolis_hasting::anneal
                    (this,&local_1638,&local_1720,linear_schedule,&local_1578,local_17c4,
                     (mt19937 *)local_13b8);
          if (local_1578.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_1578.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
        }
        iVar10 = std::__cxx11::string::compare((char *)&local_1740);
        if (iVar10 == 0) {
          std::vector<float,_std::allocator<float>_>::vector(&local_1590,&local_17b8);
          metropolis_hasting::anneal
                    (this,&local_1638,&local_1720,logarithmic_schedule,&local_1590,local_17c4,
                     (mt19937 *)local_13b8);
          if (local_1590.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_1590.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
        }
        iVar10 = std::__cxx11::string::compare((char *)&local_1740);
        if (iVar10 == 0) {
          std::vector<float,_std::allocator<float>_>::vector(&local_15a8,&local_17b8);
          metropolis_hasting::anneal
                    (this,&local_1638,&local_1720,constant_schedule,&local_15a8,local_17c4,
                     (mt19937 *)local_13b8);
          if (local_15a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_15a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
        }
        blockmodel_t::get_memberships(&local_15c0,&local_1638);
        output_vec<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                  (&local_15c0,(ostream *)&std::cout);
      }
      if (local_15c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_15c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *)&local_1788);
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::~vector(&local_1720);
      if (local_1638.memberships_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1638.memberships_.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_1638.n_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1638.n_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&local_1638.k_);
      if (local_16e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_16e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      std::
      vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
      ::~vector(&local_16a0);
      if (local_1708.
          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1708.
                        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      iVar10 = 0;
      goto LAB_00116235;
    }
    lVar24 = 0x18;
    pcVar28 = "n is required (-n flag)\n";
  }
LAB_00116228:
  iVar10 = 1;
  std::__ostream_insert<char,std::char_traits<char>>(poVar33,pcVar28,lVar24);
LAB_00116235:
  local_1458[0] = std::ios::clear;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_13e8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(local_1418);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  ::~_Rb_tree(local_1448);
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(local_1490);
  if (local_14b8 != (void *)0x0) {
    operator_delete(local_14b8);
    local_14b8 = (void *)0x0;
    local_14b0 = 0;
    local_14a8 = 0;
    local_14a0 = 0;
    local_1498 = 0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(local_14d0);
  if (local_14f8[0] != local_14e8) {
    operator_delete(local_14f8[0]);
  }
  if (local_17b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_17b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1740._M_dataplus._M_p != &local_1740.field_2) {
    operator_delete(local_1740._M_dataplus._M_p);
  }
  if (local_1758.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1758.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1668.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1668.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1688._M_dataplus._M_p != &local_1688.field_2) {
    operator_delete(local_1688._M_dataplus._M_p);
  }
  return iVar10;
}

Assistant:

int main(int argc, char const *argv[]) {
    /* ~~~~~ Program options ~~~~~~~*/
    std::string edge_list_path;
    float_vec_t probabilities;
    uint_vec_t n;
    unsigned int burn_in;
    unsigned int sampling_steps;
    unsigned int sampling_frequency;
    bool randomize = false;
    bool use_ppm = false;
    bool use_single_vertex = false;
    bool maximize = false;
    std::string cooling_schedule;
    float_vec_t cooling_schedule_kwargs(2,0);
    unsigned int seed = 0;

    po::options_description description("Options");
    description.add_options()
    ("edge_list_path,e", po::value<std::string>(&edge_list_path), 
        "Path to edge list file.")
    ("probabilities,P", po::value<float_vec_t>(&probabilities)->multitoken(), 
        "In normal mode (SBM): probability matrix in row major order. In PPM mode: p_in followed by p_out.")
    ("n,n", po::value<uint_vec_t>(&n)->multitoken(), 
        "Block sizes vector.\n")
    ("burn_in,b", po::value<unsigned int>(&burn_in)->default_value(1000),
        "Burn-in time.")
    ("sampling_steps,t", po::value<unsigned int>(&sampling_steps)->default_value(1000),
        "Number of sampling steps in marginalize mode. Length of the simulated annealing process.")
    ("sampling_frequency,f", po::value<unsigned int>(&sampling_frequency)->default_value(10),
        "Number of step between each sample in marginalize mode. Unused in likelihood maximization mode.")
    ("randomize,r",
        "Randomize initial block state.")
    ("use_ppm,u",
        "Use PPM transition ratios (defaults to SBM).")
    ("use_single_vertex,s",
        "Use single vertex proposal distribution (defaults to vertices swap).")
    ("maximize,m",
        "Maximize likelihood instead of marginalizing.")
    ("cooling_schedule,c", po::value<std::string>(&cooling_schedule)->default_value("exponential"),
        "Cooling schedule for the simulated annealing algorithm. Options are exponential, linear, logarithmic and constant.")
    ("cooling_schedule_kwargs,a", po::value<float_vec_t>(&cooling_schedule_kwargs)->multitoken(),
        "Additional arguments for the cooling schedule provided as a list of floats. "\
        "Depends on the choice of schedule:\n"\
         "Exponential: T_0 (init. temperature > 0)\n"\
         "             alpha (in ]0,1[).\n"\
         "Linear: T_0 (init. temperature > 0)\n"\
         "        eta (rate of decline).\n"\
         "Logarithmic: c (rate of decline)\n"\
         "             d (delay > 1)\n"\
         "Constant: T (temperature > 0)")
    ("seed,d", po::value<unsigned int>(&seed),
        "Seed of the pseudo random number generator (Mersenne-twister 19937). A random seed is used if seed is not specified.")
    ("help,h", "Produce this help message.")
    ;
    po::variables_map var_map;
    po::store(po::parse_command_line(argc,argv,description), var_map);
    po::notify(var_map);
    if (var_map.count("help") > 0 || argc == 1) {
	#if OUTPUT_HISTORY == 0
		std::cout << "MCMC algorithms for the SBM (final output only)\n";
       	#else
		std::cout << "MCMC algorithms for the SBM (output intermediate states)\n";
	#endif
	std::cout << "Usage:\n"
                  << "  "+std::string(argv[0])+" [--option_1=value] [--option_s2=value] ...\n";
        std::cout << description;
        return 0;
    }
    if (var_map.count("edge_list_path") == 0) {
        std::cout << "edge_list_path is required (-e flag)\n";
        return 1;
    }
    if (var_map.count("n") == 0) {
        std::cout << "n is required (-n flag)\n";
        return 1;
    }
    if (var_map.count("randomize") > 0) {
        randomize = true;
    }
    if (var_map.count("use_ppm") > 0) {
        use_ppm = true;
    }
    if (var_map.count("use_single_vertex") > 0) {
        use_single_vertex = true;
    }
    if (var_map.count("maximize") > 0) {
        maximize = true;
        if (var_map.count("cooling_schedule_kwargs") == 0)
        {
          // defaults
          if (cooling_schedule == "exponential")
          {
            cooling_schedule_kwargs[0] = 1;
            cooling_schedule_kwargs[1] = 0.99;
          } 
          if (cooling_schedule == "linear")
          {
            cooling_schedule_kwargs[0] = sampling_steps + 1;
            cooling_schedule_kwargs[1] = 1;
          }
          if (cooling_schedule == "logarithmic")
          {
            cooling_schedule_kwargs[0] = 1;
            cooling_schedule_kwargs[1] = 1;
          }
          if (cooling_schedule == "constant")
          {
            cooling_schedule_kwargs[0] = 1;
          }
        }
        else
        {
          // kwards not defaulted, must check.
          if (cooling_schedule == "exponential")
          {
            if (cooling_schedule_kwargs[0] <= 0)
            {
              std::cerr << "Invalid cooling schedule argument for linear schedule: T_0 must be grater than 0.\n";
              std::cerr << "Passed value: T_0=" << cooling_schedule_kwargs[0] << "\n";
              return 1;
            }
            if (cooling_schedule_kwargs[1] <= 0 || cooling_schedule_kwargs[1] >= 1)
            {
              std::cerr << "Invalid cooling schedule argument for exponential schedule: alpha must be in ]0,1[.\n";
              std::cerr << "Passed value: alpha=" << cooling_schedule_kwargs[1] << "\n";
              return 1;
            }
          }
          else if (cooling_schedule == "linear")
          {
            if (cooling_schedule_kwargs[0] <= 0)
            {
              std::cerr << "Invalid cooling schedule argument for linear schedule: T_0 must be grater than 0.\n";
              std::cerr << "Passed value: T_0=" << cooling_schedule_kwargs[0] << "\n";
              return 1;
            }
            if (cooling_schedule_kwargs[1] <= 0 || cooling_schedule_kwargs[1] > cooling_schedule_kwargs[0])
            {
              std::cerr << "Invalid cooling schedule argument for linear schedule: eta must be in ]0, T_0].\n";
              std::cerr << "Passed value: T_0=" << cooling_schedule_kwargs[0]
                        << ", eta=" << cooling_schedule_kwargs[1] << "\n";
              return 1;
            }
            if (cooling_schedule_kwargs[1] * sampling_steps > cooling_schedule_kwargs[0])
            {
              std::cerr << "Invalid cooling schedule argument for linear schedule: eta * sampling_steps must be smaller or equal to T_0.\n";
              std::cerr << "Passed value: eta*sampling_steps=" << cooling_schedule_kwargs[1] * sampling_steps
                        << ", T_0=" << cooling_schedule_kwargs[0] << "\n";
              return 1;
            }
          }
          else if (cooling_schedule == "logarithmic")
          {
            if (cooling_schedule_kwargs[0] <= 0)
            {
              std::cerr << "Invalid cooling schedule argument for logarithmic schedule: c must be greater than 0.\n";
              std::cerr << "Passed value: c=" << cooling_schedule_kwargs[0] << "\n";
              return 1;
            }
            if (cooling_schedule_kwargs[1] <= 0)
            {
              std::cerr << "Invalid cooling schedule argument for logarithmic schedule: d must be greater than 0.\n";
              std::cerr << "Passed value: d=" << cooling_schedule_kwargs[1] << "\n";
              return 1;
            }
          }
          else if (cooling_schedule == "constant")
          {
            if (cooling_schedule_kwargs[0] <= 0)
            {
              std::cerr << "Invalid cooling schedule argument for constant schedule: temperature must be greater than 0.\n";
              std::cerr << "Passed value: T=" << cooling_schedule_kwargs[0] << "\n";
              return 1;
            }
          }
          else
          {
            std::cerr << "Invalid cooling schedule. Options are exponential, linear, logarithmic.\n";
            return 1;
          }
        }
    }
    if (var_map.count("seed") == 0) {
        // seeding based on the clock
        seed = (unsigned int) std::chrono::high_resolution_clock::now().time_since_epoch().count();
    }
    /* ~~~~~ Setup objects ~~~~~~~*/
    std::mt19937 engine(seed);
    // number of blocks
    unsigned int g = n.size();
    // number of vertices
    unsigned int N = 0;
    for (unsigned int i = 0; i < g; ++i) {
      N += n[i];
    }
    // Graph structure
    edge_list_t edge_list;
    load_edge_list(edge_list, edge_list_path);
    adj_list_t adj_list = edge_to_adj(edge_list, N);
    edge_list.clear();
    // memberships from block sizes
    uint_vec_t memberships_init;
    {
      unsigned int accu = 0;
      for (auto it = n.begin(); it != n.end(); ++it) {
          accu += *it;
      }
      memberships_init.resize(accu, 0);
      unsigned shift = 0;
      for (unsigned int r = 0; r < n.size(); ++r) {
          for (unsigned int i = 0; i < n[r]; ++i) {
              memberships_init[shift + i] = r;
          }
          shift += n[r];
      }
    }
    // blockmodel
    blockmodel_t blockmodel(memberships_init, g, adj_list.size(), &adj_list);
    memberships_init.clear();
    if (randomize) {
        blockmodel.shuffle(engine);
    }
    // probabilities
    float_mat_t p(g, float_vec_t(g, 0));
    if (!use_ppm)
    {
      for (unsigned int r = 0; r < g; ++r)
      {
        for (unsigned int s = 0; s < g; ++s)
        {
          p[r][s] = probabilities[s + r*g];
        }
      }
    }
    else
    {
      for (unsigned int r = 0; r < g; ++r)
      {
        p[r][r] = probabilities[0];
        for (unsigned int s = r + 1; s < g; ++s)
        {
          p[r][s] = probabilities[1];
          p[s][r] = probabilities[1];
        }
      }
    }
    // Bind proper Metropolis-Hasting algorithm
    std::shared_ptr<metropolis_hasting> algorithm;
    if (!use_ppm && use_single_vertex) {
        algorithm = std::make_shared<mh_single_vertex_sbm>();
    }
    else if (use_ppm && use_single_vertex) {
        algorithm = std::make_shared<mh_single_vertex_ppm>();    
    }
    else if (!use_ppm &&  !use_single_vertex) {
        algorithm = std::make_shared<mh_vertices_swap_sbm>();     
    }
    else if (use_ppm && !use_single_vertex) {
        algorithm = std::make_shared<mh_vertices_swap_ppm>();     
    }

    /* ~~~~~ Logging ~~~~~~~*/
    #if LOGGING == 1
    std::clog << "edge_list_path: " << edge_list_path << "\n";
    std::clog << "probabilities:\n";
    output_mat<float_mat_t>(p, std::clog);
    std::clog << "sizes (g=" << n.size() << "): ";
    for (auto it = n.begin(); it != n.end(); ++it)
        std::clog << *it << " ";
    std::clog << "\n";
    std::clog << "burn_in: " << burn_in << "\n";
    std::clog << "sampling_steps: " << sampling_steps << "\n";
    std::clog << "sampling_frequency: " << sampling_frequency << "\n";
    if (maximize) {std::clog << "maximize: true\n";}
    else {std::clog << "maximize: false\n";}
    if (use_ppm) {std::clog << "use_ppm: true\n";}
    else {std::clog << "use_ppm: false\n";}
    if (use_single_vertex) {std::clog << "use_single_vertex: true\n";}
    else {std::clog << "use_single_vertex: false\n";}
    if (randomize) {std::clog << "randomize: true\n";}
    else {std::clog << "randomize: false\n";}
    if (maximize)
    {
      std::clog << "cooling_schedule: " << cooling_schedule << "\n";
      std::clog << "cooling_schedule_kwargs: ";
      output_vec<float_vec_t>(cooling_schedule_kwargs);
    }
    std::clog << "seed: " << seed << "\n";
    #endif

    /* ~~~~~ Actual algorithm ~~~~~~~*/
    double rate = 0;
    uint_mat_t marginal(adj_list.size(), uint_vec_t(g, 0));
    if (maximize)
    {
      if (cooling_schedule == "exponential")
      {
        algorithm->anneal(blockmodel, p, &exponential_schedule, cooling_schedule_kwargs, sampling_steps, engine);
      }
      if (cooling_schedule == "linear")
      {
        algorithm->anneal(blockmodel, p, &linear_schedule, cooling_schedule_kwargs, sampling_steps, engine);
      }
      if (cooling_schedule == "logarithmic")
      {
        algorithm->anneal(blockmodel, p, &logarithmic_schedule, cooling_schedule_kwargs, sampling_steps, engine);
      }
      if (cooling_schedule == "constant")
      {
        algorithm->anneal(blockmodel, p, &constant_schedule, cooling_schedule_kwargs, sampling_steps, engine);
      }
      output_vec<uint_vec_t>(blockmodel.get_memberships(), std::cout);
    }
    else  // marginalize
    {  
      rate = algorithm->marginalize(blockmodel, marginal, p, burn_in, sampling_frequency, sampling_steps, engine);
      uint_vec_t memberships(blockmodel.get_N(), 0);
      for (unsigned int i = 0; i < blockmodel.get_N(); ++i)
      {
        unsigned int max = 0;
        for (unsigned int r = 0; r < g; ++r)
        {
          if (marginal[i][r] > max)
          {
            memberships[i] = r;
            max = marginal[i][r];
          }
        }
      }
      output_vec<uint_vec_t>(memberships, std::cout);
      std::clog << "acceptance ratio " <<  rate  <<  "\n";
    }
    return 0;
}